

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMemory.cpp
# Opt level: O2

void __thiscall Lodtalk::StackFrame::updateMarriedSpouseState(StackFrame *this)

{
  uint8_t *puVar1;
  uint __line;
  uint8_t *puVar2;
  undefined8 *puVar3;
  char *__assertion;
  
  if (this->framePointer[-0xe] == '\0') {
    __assertion = "hasContext()";
    __line = 0x77;
  }
  else {
    puVar3 = *(undefined8 **)(this->framePointer + -0x18);
    if (puVar3 != &NilObject) {
      puVar3[3] = this->stackPointer + 1;
      puVar1 = this->stackPointer;
      puVar3 = puVar3 + (ulong)this->framePointer[-0x10] + 8;
      for (puVar2 = this->framePointer + -0x28; puVar1 <= puVar2; puVar2 = puVar2 + -8) {
        *puVar3 = *(undefined8 *)puVar2;
        puVar3 = puVar3 + 1;
      }
      return;
    }
    __assertion = "!isNil(context)";
    __line = 0x79;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackMemory.cpp"
                ,__line,"void Lodtalk::StackFrame::updateMarriedSpouseState()");
}

Assistant:

void StackFrame::updateMarriedSpouseState()
{
    assert(hasContext());
    auto context = reinterpret_cast<Context*> (getThisContext().pointer);
    assert(!isNil(context));
    context->stackp = Oop::fromPointer(stackPointer + 1);

    // Copy the temporaries back to the context.
    auto currentTemporary = reinterpret_cast<Oop*> (framePointer + InterpreterStackFrame::FirstTempOffset);
    auto temporaryEnd = reinterpret_cast<Oop*> (stackPointer);
    auto currentTempIndex = getArgumentCount();
    for (;  currentTemporary >= temporaryEnd; --currentTemporary, currentTempIndex++)
        context->data[currentTempIndex] = *currentTemporary;
}